

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O2

wstring * __thiscall
lzstring::LZString::DeCompressFromEncodedURIComponent
          (wstring *__return_storage_ptr__,LZString *this,string *input)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  if (input->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  }
  else {
    local_10 = std::
               _Function_handler<wchar_t_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/243286065[P]lz-string-cpp/LZString.cpp:92:38)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<wchar_t_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/243286065[P]lz-string-cpp/LZString.cpp:92:38)>
               ::_M_manager;
    local_28._M_unused._M_object = this;
    local_28._8_8_ = input;
    DeCompress_abi_cxx11_
              (__return_storage_ptr__,this,(int)input->_M_string_length,0x20,
               (GetNextCharFunc *)&local_28);
    std::_Function_base::~_Function_base((_Function_base *)&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring LZString::DeCompressFromEncodedURIComponent(const std::string &input)
{
	if (input.empty())
		return std::wstring();

	return DeCompress(input.size(), 32, [this, &input](int index) { return (wchar_t)m_keyStrUrisafeDict[input[index]]; });
}